

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

bool tinyusdz::detail::ParseMaterialXValue(string *typeName,string *str,Value *value,string *err)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *args;
  StreamReader sr;
  ostringstream ss_e_1;
  AsciiParser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  StreamReader local_690;
  string local_670 [3];
  ios_base local_600 [264];
  undefined1 local_4f8 [1224];
  
  args = err;
  bVar1 = is_supported_type(typeName);
  if (bVar1) {
    local_690.binary_ = (uint8_t *)(str->_M_dataplus)._M_p;
    local_690.length_ = str->_M_string_length;
    local_690.swap_endian_ = false;
    local_690.idx_ = 0;
    ascii::AsciiParser::AsciiParser((AsciiParser *)local_4f8,&local_690);
    iVar2 = ::std::__cxx11::string::compare((char *)typeName);
    if (iVar2 == 0) {
      ParseValue<int>((AsciiParser *)local_4f8,(int *)local_670,err);
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((char *)typeName);
      if (iVar2 == 0) {
        ParseValue<bool>((AsciiParser *)local_4f8,(bool *)local_670,err);
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)typeName);
        if (iVar2 == 0) {
          ParseValue<std::array<float,2ul>>((AsciiParser *)local_4f8,(float2 *)local_670,err);
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)typeName);
          if (iVar2 == 0) {
            ParseValue<std::array<float,3ul>>((AsciiParser *)local_4f8,(float3 *)local_670,err);
          }
          else {
            iVar2 = ::std::__cxx11::string::compare((char *)typeName);
            if (iVar2 == 0) {
              ParseValue<std::array<float,4ul>>((AsciiParser *)local_4f8,(float4 *)local_670,err);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_670,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                         ,0x51);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_670,"ParseMaterialXValue",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"():",3);
              poVar3 = (ostream *)::std::ostream::operator<<(local_670,0x16f);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
              ::std::operator+(&local_6b0,"TODO: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               typeName);
              poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_670,local_6b0._M_dataplus._M_p,
                                  local_6b0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
                operator_delete(local_6b0._M_dataplus._M_p,
                                local_6b0.field_2._M_allocated_capacity + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)err,(ulong)local_6b0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
                  operator_delete(local_6b0._M_dataplus._M_p,
                                  local_6b0.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
              ::std::ios_base::~ios_base(local_600);
            }
          }
        }
      }
    }
    ascii::AsciiParser::~AsciiParser((AsciiParser *)local_4f8);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f8,"ParseMaterialXValue",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4f8,0x14e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_690.binary_ = &local_690.swap_endian_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_690,"Invalid/unsupported type: {}","");
    fmt::format<std::__cxx11::string>
              (local_670,(fmt *)&local_690,(string *)typeName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_4f8,local_670[0]._M_dataplus._M_p,
                        local_670[0]._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670[0]._M_dataplus._M_p != &local_670[0].field_2) {
      operator_delete(local_670[0]._M_dataplus._M_p,local_670[0].field_2._M_allocated_capacity + 1);
    }
    if ((bool *)local_690.binary_ != &local_690.swap_endian_) {
      operator_delete(local_690.binary_,CONCAT71(local_690.pad_,local_690.swap_endian_) + 1);
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_670[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670[0]._M_dataplus._M_p != &local_670[0].field_2) {
        operator_delete(local_670[0]._M_dataplus._M_p,local_670[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
    ::std::ios_base::~ios_base((ios_base *)(local_4f8 + 0x70));
  }
  return false;
}

Assistant:

bool ParseMaterialXValue(const std::string &typeName, const std::string &str,
                         value::Value *value, std::string *err) {
  (void)value;

  if (!is_supported_type(typeName)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Invalid/unsupported type: {}", typeName));
  }

  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  if (typeName.compare("integer") == 0) {
    int val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("boolean") == 0) {
    bool val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector2") == 0) {
    value::float2 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector3") == 0) {
    value::float3 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector4") == 0) {
    value::float4 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else {
    PUSH_ERROR_AND_RETURN("TODO: " + typeName);
  }

  // TODO
  return false;
}